

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall Fossilize::ConcurrentDatabase::prepare(ConcurrentDatabase *this)

{
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *puVar1;
  DatabaseMode DVar2;
  uint uVar3;
  Impl *pIVar4;
  __uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  this_00;
  pointer puVar5;
  StreamArchive *this_01;
  uint *puVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  pointer ppEVar10;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *puVar11;
  DatabaseInterface *pDVar12;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *extra;
  pointer puVar13;
  pointer puVar14;
  size_t extra_index;
  ulong uVar15;
  ulong uVar16;
  uint *puVar17;
  
  DVar2 = this->mode;
  if (OverWrite < DVar2) {
    return false;
  }
  if (DVar2 != ReadOnly) {
    pIVar4 = (this->super_DatabaseInterface).impl;
    if ((pIVar4->sub_databases_in_whitelist).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pIVar4->sub_databases_in_whitelist).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return false;
    }
    if (DVar2 != ReadOnly) goto LAB_0016f16c;
  }
  if (((this->bucket_dirname)._M_string_length != 0) &&
     ((this->bucket_basename)._M_string_length != 0)) {
    return false;
  }
LAB_0016f16c:
  if (((this->bucket_dirname)._M_string_length != 0) && (bVar7 = setup_bucket(this), !bVar7)) {
    return false;
  }
  pIVar4 = (this->super_DatabaseInterface).impl;
  ppEVar10 = (pIVar4->imported_metadata).
             super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar10 !=
      (pIVar4->imported_metadata).
      super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pDVar12 = (this->readonly_interface)._M_t.
              super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
              ._M_t.
              super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
              .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar12 != (DatabaseInterface *)0x0) {
      DatabaseInterface::add_imported_metadata(pDVar12,*ppEVar10);
    }
    pIVar4 = (this->super_DatabaseInterface).impl;
    ppEVar10 = (pIVar4->imported_metadata).
               super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(pIVar4->imported_metadata).
                          super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar10)) {
      uVar15 = 0;
      do {
        puVar13 = (this->extra_readonly).
                  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((uVar15 < (ulong)((long)(this->extra_readonly).
                                    super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar13 >> 3)
            ) && (this_00._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                       puVar13[uVar15]._M_t.
                       super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       ._M_t,
                 (_Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  )this_00._M_t.
                   super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                   .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl !=
                 (DatabaseInterface *)0x0)) {
          DatabaseInterface::add_imported_metadata
                    ((DatabaseInterface *)
                     this_00._M_t.
                     super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl,
                     ppEVar10[uVar15 + 1]);
        }
        pIVar4 = (this->super_DatabaseInterface).impl;
        ppEVar10 = (pIVar4->imported_metadata).
                   super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = uVar15 + 2;
        uVar15 = uVar15 + 1;
      } while (uVar16 < (ulong)((long)(pIVar4->imported_metadata).
                                      super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar10 >>
                               3));
    }
  }
  if (this->has_prepared_readonly == false) {
    puVar1 = &this->readonly_interface;
    pDVar12 = (this->readonly_interface)._M_t.
              super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
              ._M_t.
              super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
              .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar12 != (DatabaseInterface *)0x0) &&
       (iVar9 = (*pDVar12->_vptr_DatabaseInterface[2])(), (char)iVar9 == '\0')) {
      pDVar12 = (puVar1->_M_t).
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (puVar1->_M_t).
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
           (DatabaseInterface *)0x0;
      if (pDVar12 != (DatabaseInterface *)0x0) {
        (*pDVar12->_vptr_DatabaseInterface[1])();
      }
    }
    puVar13 = (this->extra_readonly).
              super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->extra_readonly).
             super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar13 != puVar5) {
      do {
        this_01 = (StreamArchive *)
                  (puVar13->_M_t).
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        if (this_01 != (StreamArchive *)0x0) {
          StreamArchive::resolve_path(this_01,&this->base_path);
          iVar9 = (*((puVar13->_M_t).
                     super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                     .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl)->
                    _vptr_DatabaseInterface[2])();
          if ((char)iVar9 == '\0') {
            pDVar12 = (puVar13->_M_t).
                      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
            (puVar13->_M_t).
            super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
            .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                 (DatabaseInterface *)0x0;
            if (pDVar12 != (DatabaseInterface *)0x0) {
              (*pDVar12->_vptr_DatabaseInterface[1])();
            }
          }
        }
        puVar13 = puVar13 + 1;
      } while (puVar13 != puVar5);
    }
    pIVar4 = (this->super_DatabaseInterface).impl;
    puVar6 = (pIVar4->sub_databases_in_whitelist).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar17 = (pIVar4->sub_databases_in_whitelist).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start; bVar7 = puVar17 != puVar6, bVar7;
        puVar17 = puVar17 + 1) {
      uVar3 = *puVar17;
      puVar11 = puVar1;
      if ((ulong)uVar3 == 0) {
LAB_0016f2f3:
        pDVar12 = (puVar11->_M_t).
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      }
      else {
        puVar13 = (this->extra_readonly).
                  super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar3 <=
            (ulong)((long)(this->extra_readonly).
                          super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar13 >> 3)) {
          puVar11 = puVar13 + (uVar3 - 1);
          goto LAB_0016f2f3;
        }
        pDVar12 = (DatabaseInterface *)0x0;
      }
      if ((pDVar12 != (DatabaseInterface *)0x0) &&
         (bVar8 = DatabaseInterface::add_to_implicit_whitelist
                            (&this->super_DatabaseInterface,pDVar12), !bVar8)) {
        if (bVar7) {
          return false;
        }
        break;
      }
    }
    if (((this->super_DatabaseInterface).impl)->imported_concurrent_metadata ==
        (ExportedMetadataHeader *)0x0) {
      pDVar12 = (puVar1->_M_t).
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar12 != (DatabaseInterface *)0x0) {
        prime_read_only_hashes(this,pDVar12);
      }
      puVar5 = (this->extra_readonly).
               super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar13 = (this->extra_readonly).
                     super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar5;
          puVar13 = puVar13 + 1) {
        pDVar12 = (puVar13->_M_t).
                  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        if (pDVar12 != (DatabaseInterface *)0x0) {
          prime_read_only_hashes(this,pDVar12);
        }
      }
    }
    if (this->mode == Append) {
      pDVar12 = (puVar1->_M_t).
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (puVar1->_M_t).
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
           (DatabaseInterface *)0x0;
      if (pDVar12 != (DatabaseInterface *)0x0) {
        (*pDVar12->_vptr_DatabaseInterface[1])();
      }
      puVar13 = (this->extra_readonly).
                super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (this->extra_readonly).
               super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar14 = puVar13;
      if (puVar5 != puVar13) {
        do {
          pDVar12 = (puVar14->_M_t).
                    super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                    .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
          if (pDVar12 != (DatabaseInterface *)0x0) {
            (*pDVar12->_vptr_DatabaseInterface[1])();
          }
          (puVar14->_M_t).
          super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
          ._M_t.
          super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
          .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
               (DatabaseInterface *)0x0;
          puVar14 = puVar14 + 1;
        } while (puVar14 != puVar5);
        (this->extra_readonly).
        super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar13;
      }
    }
  }
  this->has_prepared_readonly = true;
  return true;
}

Assistant:

bool prepare() override
	{
		if (mode != DatabaseMode::Append &&
		    mode != DatabaseMode::ReadOnly &&
		    mode != DatabaseMode::AppendWithReadOnlyAccess &&
		    mode != DatabaseMode::OverWrite)
			return false;

		if (mode != DatabaseMode::ReadOnly && !impl->sub_databases_in_whitelist.empty())
			return false;

		if (mode == DatabaseMode::ReadOnly && !bucket_dirname.empty() && !bucket_basename.empty())
			return false;

		if (!bucket_dirname.empty() && !setup_bucket())
			return false;

		// Set inherited metadata in sub-databases before we prepare them.
		if (!impl->imported_metadata.empty())
		{
			if (readonly_interface)
				readonly_interface->add_imported_metadata(impl->imported_metadata.front());

			for (size_t i = 1; i < impl->imported_metadata.size(); i++)
			{
				size_t extra_index = i - 1;
				if (extra_index < extra_readonly.size() && extra_readonly[extra_index])
					extra_readonly[extra_index]->add_imported_metadata(impl->imported_metadata[i]);
			}
		}

		if (!has_prepared_readonly)
		{
			// Prepare everything.
			// It's okay if the database doesn't exist.
			if (readonly_interface && !readonly_interface->prepare())
				readonly_interface.reset();

			for (auto &extra : extra_readonly)
			{
				if (extra)
				{
					static_cast<StreamArchive &>(*extra).resolve_path(base_path);
					if (!extra->prepare())
						extra.reset();
				}
			}

			// Promote databases to whitelist.
			for (unsigned index : impl->sub_databases_in_whitelist)
			{
				DatabaseInterface *iface = nullptr;
				if (index == 0)
					iface = readonly_interface.get();
				else if (index <= extra_readonly.size())
					iface = extra_readonly[index - 1].get();

				// It's okay if the archive does not exist, we just ignore it.
				if (iface && !add_to_implicit_whitelist(*iface))
					return false;
			}

			// Prime the hashmaps, however, we'll rely on concurrent metadata if we have it to avoid memory bloat.
			if (!impl->imported_concurrent_metadata)
			{
				if (readonly_interface)
					prime_read_only_hashes(*readonly_interface);

				for (auto &extra : extra_readonly)
					if (extra)
						prime_read_only_hashes(*extra);
			}

			// We only need the database for priming purposes.
			if (mode == DatabaseMode::Append)
			{
				readonly_interface.reset();
				extra_readonly.clear();
			}
		}

		has_prepared_readonly = true;
		return true;
	}